

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool expr_operand_local(Parser *psr,Node *result,uint64_t name)

{
  int local_30;
  int local_2c;
  int i;
  int slot;
  uint64_t name_local;
  Node *result_local;
  Parser *psr_local;
  
  local_2c = -1;
  local_30 = psr->scope->first_local;
  do {
    if (psr->locals_count <= local_30) {
LAB_0011c927:
      if (local_2c != -1) {
        result->type = NODE_LOCAL;
        (result->field_1).slot = (uint8_t)local_2c;
      }
      return local_2c != -1;
    }
    if (psr->locals[local_30].name == name) {
      local_2c = local_30 - psr->scope->first_local;
      goto LAB_0011c927;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static bool expr_operand_local(Parser *psr, Node *result, uint64_t name) {
	int slot = -1;
	for (int i = psr->scope->first_local; i < psr->locals_count; i++) {
		if (psr->locals[i].name == name) {
			slot = i - psr->scope->first_local;
			break;
		}
	}

	// Couldn't find the name in the current scope
	if (slot == -1) {
		return false;
	}

	result->type = NODE_LOCAL;
	result->slot = (uint8_t) slot;
	return true;
}